

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void concave_shell_move(CHAR_DATA *ch,int *dirptr,ROOM_INDEX_DATA *oldroom)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  EXIT_DATA *pEVar4;
  CHAR_DATA *pCVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long in_RDX;
  int *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var9;
  CHAR_DATA *wch_next;
  CHAR_DATA *wch;
  char *direction;
  EXIT_DATA *pexit;
  bool stopped;
  bool verbose;
  CHAR_DATA *in_stack_000000b0;
  int range;
  int dir;
  int i;
  char buf [4608];
  undefined4 in_stack_ffffffffffffed28;
  int in_stack_ffffffffffffed2c;
  int in_stack_ffffffffffffed30;
  int in_stack_ffffffffffffed34;
  undefined4 in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  CHAR_DATA *in_stack_ffffffffffffed40;
  char *pcVar10;
  CHAR_DATA *in_stack_ffffffffffffed48;
  CHAR_DATA *local_1240;
  int local_121c;
  char local_1218 [4624];
  CHAR_DATA *local_8;
  
  bVar6 = false;
  iVar2 = *in_RSI;
  if (in_RDI->in_room->vnum == *(short *)(in_RDX + 0x13a)) {
    if ((in_RDI->disrupted & 1U) == 0) {
      local_8 = in_RDI;
      bVar7 = is_affected(in_RDI,(int)gsn_bind_feet);
      if (bVar7) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
      }
      else {
        sVar1 = local_8->level;
        flag_name_lookup(CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                         (flag_type *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30))
        ;
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
        uVar3 = local_8->comm[0];
        _Var9 = std::pow<int,int>(0,0x6e40c4);
        bVar7 = (uVar3 & (long)_Var9) == 0;
        if (bVar7) {
          _Var9 = std::pow<int,int>(0,0x6e40e9);
          local_8->comm[0] = (long)_Var9 | local_8->comm[0];
        }
        pEVar4 = local_8->in_room->exit[iVar2];
        if ((((pEVar4 == (EXIT_DATA *)0x0) || ((pEVar4->u1).to_room == (ROOM_INDEX_DATA *)0x0)) ||
            ((uVar3 = pEVar4->exit_info[0], _Var9 = std::pow<int,int>(0,0x6e4174),
             (uVar3 & (long)_Var9) != 0 &&
             (bVar8 = is_affected_by((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                                     in_stack_ffffffffffffed34), !bVar8)))) ||
           ((uVar3 = pEVar4->exit_info[0], _Var9 = std::pow<int,int>(0,0x6e41c2),
            (uVar3 & (long)_Var9) != 0 &&
            (uVar3 = pEVar4->exit_info[0], _Var9 = std::pow<int,int>(0,0x6e41f5),
            (uVar3 & (long)_Var9) != 0)))) {
          act((char *)in_stack_ffffffffffffed40,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
              (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
              (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
        }
        else {
          for (local_121c = 1; local_121c <= (int)sVar1 / 3; local_121c = local_121c + 1) {
            move_char((CHAR_DATA *)buf._912_8_,buf._908_4_,(bool)buf[0x38b],(bool)buf[0x38a]);
            pEVar4 = local_8->in_room->exit[iVar2];
            if ((((pEVar4 == (EXIT_DATA *)0x0) || ((pEVar4->u1).to_room == (ROOM_INDEX_DATA *)0x0))
                || ((uVar3 = pEVar4->exit_info[0], _Var9 = std::pow<int,int>(0,0x6e42d2),
                    (uVar3 & (long)_Var9) != 0 &&
                    (bVar8 = is_affected_by((CHAR_DATA *)
                                            CONCAT44(in_stack_ffffffffffffed3c,
                                                     in_stack_ffffffffffffed38),
                                            in_stack_ffffffffffffed34), !bVar8)))) ||
               ((uVar3 = pEVar4->exit_info[0], _Var9 = std::pow<int,int>(0,0x6e431d),
                (uVar3 & (long)_Var9) != 0 &&
                (uVar3 = pEVar4->exit_info[0], _Var9 = std::pow<int,int>(0,0x6e4354),
                (uVar3 & (long)_Var9) != 0)))) {
              send_to_char((char *)in_stack_ffffffffffffed40,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
              act((char *)in_stack_ffffffffffffed40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                  (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
                  (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
              dice(in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c);
              pcVar10 = "bone-jarring collision";
              damage_new(_dir,in_stack_000000b0,pexit._4_4_,(int)pexit,direction._4_4_,
                         direction._3_1_,direction._2_1_,buf._24_4_,buf._32_4_,(char *)buf._40_8_);
              WAIT_STATE((CHAR_DATA *)pcVar10,in_stack_ffffffffffffed3c);
              local_8->position = 5;
              break;
            }
            pCVar5 = local_8->in_room->people;
            do {
              local_1240 = pCVar5;
              if (local_1240 == (CHAR_DATA *)0x0) goto LAB_006e4656;
              pCVar5 = local_1240->next_in_room;
              bVar8 = is_npc((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
            } while ((((!bVar8) ||
                      ((((uVar3 = local_1240->act[0], _Var9 = std::pow<int,int>(0,0x6e44b0),
                         (uVar3 & (long)_Var9) == 0 || ((int)local_1240->level < local_8->level + 5)
                         ) && (uVar3 = local_1240->off_flags[0],
                              _Var9 = std::pow<int,int>(0,0x6e450b), (uVar3 & (long)_Var9) == 0)) ||
                       ((bVar8 = is_awake(local_1240), !bVar8 ||
                        (local_1240->fighting == (CHAR_DATA *)0x0)))))) ||
                     (bVar8 = can_see(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40), !bVar8))
                    || ((bVar8 = is_affected_by((CHAR_DATA *)
                                                CONCAT44(in_stack_ffffffffffffed3c,
                                                         in_stack_ffffffffffffed38),
                                                in_stack_ffffffffffffed34), bVar8 ||
                        (uVar3 = local_8->in_room->room_flags[0],
                        _Var9 = std::pow<int,int>(0,0x6e45ad), (uVar3 & (long)_Var9) != 0))));
            pcVar10 = pers((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
            snprintf(local_1218,0x1200,"As you hurtle along, %s suddenly obstructs your path!\n\r",
                     pcVar10);
            send_to_char((char *)in_stack_ffffffffffffed40,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38))
            ;
            WAIT_STATE(in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c);
            local_8->position = 5;
            bVar6 = true;
LAB_006e4656:
            if (bVar6) break;
          }
          if (bVar7) {
            _Var9 = std::pow<int,int>(0,0x6e4693);
            local_8->comm[0] = ((long)_Var9 ^ 0xffffffffffffffffU) & local_8->comm[0];
          }
        }
      }
    }
    else {
      act((char *)in_stack_ffffffffffffed40,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
          (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
          (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
    }
  }
  return;
}

Assistant:

void concave_shell_move(CHAR_DATA *ch, int *dirptr, ROOM_INDEX_DATA *oldroom)
{
	char buf[MSL];
	int i, dir, range;
	bool verbose = false, stopped = false;
	EXIT_DATA *pexit;
	char *direction;
	CHAR_DATA *wch, *wch_next;

	dir = *dirptr;

	if (ch->in_room->vnum != oldroom->vnum)
		return;

	if (ch->disrupted)
	{
		act("The shell of air dissipates with no effect.", ch, 0, 0, TO_ALL);
		return;
	}

	if (is_affected(ch, gsn_bind_feet))
	{
		send_to_char("Your feet are too tightly bound to the earth for the shell to move you.\n\r", ch);
		return;
	}

	range = ch->level / 3;

	direction = flag_name_lookup(dir, direction_table);
	act("The shell of air finishes forming and rushes $tward, taking you with it!", ch, direction, 0, TO_CHAR);
	act("The shell of air finishes forming and rushes $tward, taking $n with it!", ch, direction, 0, TO_ROOM);

	if (!IS_SET(ch->comm, COMM_BRIEF))
	{
		SET_BIT(ch->comm, COMM_BRIEF);
		verbose = true;
	}

	pexit = ch->in_room->exit[dir];

	if (pexit == nullptr
		|| pexit->u1.to_room == nullptr
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
	{
		act("Since the exit $t has become obstructed, the swirling winds dissipate.", ch, direction, 0, TO_ALL);
		return;
	}

	for (i = 1; i <= range; i++)
	{
		move_char(ch, dir, true, true);

		pexit = ch->in_room->exit[dir];

		if (pexit == nullptr
			|| pexit->u1.to_room == nullptr
			|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
			|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
		{
			send_to_char("Your rapid motion comes to a crashing halt as you strike an obstacle!\n\r", ch);
			act("$n flies into the room and crashes into the obstruction $tward!", ch, direction, 0, TO_ROOM);

			damage_new(ch, ch, dice(10, 10), gsn_bash, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "bone-jarring collision");
			WAIT_STATE(ch, PULSE_VIOLENCE * 2);

			ch->position = POS_RESTING;
			break;
		}

		for (wch = ch->in_room->people; wch != nullptr; wch = wch_next)
		{
			wch_next = wch->next_in_room;

			if (is_npc(wch)
				&& ((IS_SET(wch->act, ACT_AGGRESSIVE) && wch->level >= ch->level + 5)
					|| IS_SET(wch->off_flags, SPAM_MURDER))
				&& is_awake(wch)
				&& wch->fighting != nullptr
				&& can_see(wch, ch)
				&& !is_affected_by(wch, AFF_CALM)
				&& !IS_SET(ch->in_room->room_flags, ROOM_SAFE))
			{
				std::snprintf(buf, static_cast<size_t>(MSL), "As you hurtle along, %s suddenly obstructs your path!\n\r", pers(wch, ch));
				send_to_char(buf, ch);

				WAIT_STATE(ch, PULSE_VIOLENCE);

				ch->position = POS_RESTING;
				stopped = true;
				break;
			}
		}

		if (stopped)
			break;
	}

	if (verbose)
		REMOVE_BIT(ch->comm, COMM_BRIEF);
}